

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyHttpImplPrivate::QNetworkReplyHttpImplPrivate(QNetworkReplyHttpImplPrivate *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long in_FS_OFFSET;
  QUrl local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkReplyPrivate::QNetworkReplyPrivate(&this->super_QNetworkReplyPrivate);
  *(undefined ***)&this->super_QNetworkReplyPrivate = &PTR__QNetworkReplyHttpImplPrivate_002cf4b8;
  this->manager = (QNetworkAccessManager *)0x0;
  this->managerPrivate = (QNetworkAccessManagerPrivate *)0x0;
  QUrl::QUrl(&local_30);
  QHttpNetworkRequest::QHttpNetworkRequest(&this->httpRequest,&local_30,Get,NormalPriority);
  QUrl::~QUrl(&local_30);
  this->synchronous = false;
  this->state = Idle;
  this->statusCode = 0;
  (this->reasonPhrase).d.d = (Data *)0x0;
  (this->reasonPhrase).d.ptr = (char16_t *)0x0;
  (this->reasonPhrase).d.size = 0;
  (this->uploadByteDevice).super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->uploadByteDevice).super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->uploadByteDevicePosition = 0;
  this->uploadDeviceChoking = false;
  this->outgoingData = (QIODevice *)0x0;
  (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->bytesUploaded = -1;
  this->cacheLoadDevice = (QIODevice *)0x0;
  this->loadingFromCache = false;
  this->cacheSaveDevice = (QIODevice *)0x0;
  this->cacheEnabled = false;
  QUrl::QUrl(&this->urlForLastAuthentication);
  QNetworkProxy::QNetworkProxy(&this->lastProxyAuthentication);
  (this->downloadBufferPointer).d = (Data *)0x0;
  this->downloadZerocopyBuffer = (char *)0x0;
  this->downloadBufferCurrentSize = 0;
  (this->downloadBufferPointer).value.ptr = (char *)0x0;
  this->transferTimeout = (QTimer *)0x0;
  this->downloadBufferReadPosition = 0;
  this->bytesBuffered = 0;
  this->lastReadyReadEmittedSize = 0;
  this->resumeOffset = 0;
  this->bytesDownloaded = 0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cf7f0;
  *(undefined4 *)&p_Var1[1]._vptr__Sp_counted_base = 0;
  (this->pendingDownloadDataEmissions).super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (this->pendingDownloadDataEmissions).super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var1 + 1);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cf7f0;
  *(undefined4 *)&p_Var1[1]._vptr__Sp_counted_base = 0;
  (this->pendingDownloadProgressEmissions).
  super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  (this->pendingDownloadProgressEmissions).
  super___shared_ptr<QAtomicInt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)(p_Var1 + 1);
  (this->sslConfiguration).d = (QSslConfiguration *)0x0;
  this->pendingIgnoreAllSslErrors = false;
  (this->pendingIgnoreSslErrorsList).d.d = (Data *)0x0;
  (this->pendingIgnoreSslErrorsList).d.ptr = (QSslError *)0x0;
  (this->pendingIgnoreSslErrorsList).d.size = 0;
  QNetworkRequest::QNetworkRequest(&this->redirectRequest);
  (this->decompressHelper).decompressedDataBuffer.bufferCompleteSize = 0;
  (this->decompressHelper).decompressedDataBuffer.firstPos = 0;
  (this->decompressHelper).decompressedDataBuffer.buffers.d.ptr = (QByteArray *)0x0;
  (this->decompressHelper).decompressedDataBuffer.buffers.d.size = 0;
  (this->decompressHelper).compressedDataBuffer.firstPos = 0;
  (this->decompressHelper).decompressedDataBuffer.buffers.d.d = (Data *)0x0;
  (this->decompressHelper).compressedDataBuffer.buffers.d.size = 0;
  (this->decompressHelper).compressedDataBuffer.bufferCompleteSize = 0;
  (this->decompressHelper).compressedDataBuffer.buffers.d.d = (Data *)0x0;
  (this->decompressHelper).compressedDataBuffer.buffers.d.ptr = (QByteArray *)0x0;
  (this->decompressHelper).MaxDecompressedDataBufferSize = 0xa00000;
  (this->decompressHelper).decoderHasData = false;
  (this->decompressHelper).countDecompressed = false;
  (this->decompressHelper).countHelper._M_t.
  super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>._M_t.
  super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
  super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl = (QDecompressHelper *)0x0;
  (this->decompressHelper).errorStr.d.d = (Data *)0x0;
  (this->decompressHelper).errorStr.d.ptr = (char16_t *)0x0;
  (this->decompressHelper).errorStr.d.size = 0;
  (this->decompressHelper).archiveBombCheckThreshold = 0xa00000;
  (this->decompressHelper).totalUncompressedBytes = 0;
  (this->decompressHelper).totalCompressedBytes = 0;
  *(undefined8 *)((long)&(this->decompressHelper).totalCompressedBytes + 4) = 0;
  *(undefined8 *)((long)&(this->decompressHelper).totalBytesRead + 4) = 0;
  (this->decompressHelper).decoderPointer = (void *)0x0;
  (this->decompressHelper).brotliUnconsumedDataPtr = (uint8_t *)0x0;
  (this->decompressHelper).brotliUnconsumedAmount = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyHttpImplPrivate::QNetworkReplyHttpImplPrivate()
    : QNetworkReplyPrivate()
    , manager(nullptr)
    , managerPrivate(nullptr)
    , synchronous(false)
    , state(Idle)
    , statusCode(0)
    , uploadByteDevicePosition(false)
    , uploadDeviceChoking(false)
    , outgoingData(nullptr)
    , bytesUploaded(-1)
    , cacheLoadDevice(nullptr)
    , loadingFromCache(false)
    , cacheSaveDevice(nullptr)
    , cacheEnabled(false)
    , resumeOffset(0)
    , bytesDownloaded(0)
    , bytesBuffered(0)
    , transferTimeout(nullptr)
    , downloadBufferReadPosition(0)
    , downloadBufferCurrentSize(0)
    , downloadZerocopyBuffer(nullptr)
    , pendingDownloadDataEmissions(std::make_shared<QAtomicInt>())
    , pendingDownloadProgressEmissions(std::make_shared<QAtomicInt>())
    #ifndef QT_NO_SSL
    , pendingIgnoreAllSslErrors(false)
    #endif

{
}